

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_arg * __thiscall
duckdb_fmt::v6::internal::
get_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (format_arg *__return_storage_ptr__,internal *this,
          basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
          *ctx,int id)

{
  long lVar1;
  longlong lVar2;
  size_t sVar3;
  uint uVar4;
  type tVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint __val;
  uint uVar10;
  string __str;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar10 = (uint)ctx;
  basic_format_args<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  ::do_get(__return_storage_ptr__,
           (basic_format_args<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)(this + 8),uVar10);
  tVar5 = __return_storage_ptr__->type_;
  if (tVar5 == named_arg_type) {
    lVar1 = (__return_storage_ptr__->value_).field_0.long_long_value;
    lVar2 = *(longlong *)(lVar1 + 0x10);
    sVar3 = *(size_t *)(lVar1 + 0x18);
    tVar5 = *(type *)(lVar1 + 0x20);
    __return_storage_ptr__->type_ = tVar5;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar2;
    (__return_storage_ptr__->value_).field_0.string.size = sVar3;
  }
  if (tVar5 != none_type) {
    return __return_storage_ptr__;
  }
  __val = -uVar10;
  if (0 < (int)uVar10) {
    __val = uVar10;
  }
  uVar10 = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_00e83adc;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_00e83adc;
      }
      if (uVar7 < 10000) goto LAB_00e83adc;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_00e83adc:
  uVar9 = (ulong)ctx >> 0x1f & 1;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar10 + (char)uVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + uVar9,uVar10,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1dac33e);
  local_d0 = (long *)*plVar6;
  plVar8 = plVar6 + 2;
  if (local_d0 == plVar8) {
    local_c0 = *plVar8;
    lStack_b8 = plVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar8;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0 = (long *)*plVar6;
  plVar8 = plVar6 + 2;
  if (local_b0 == plVar8) {
    local_a0 = *plVar8;
    uStack_98 = (undefined4)plVar6[3];
    uStack_94 = *(undefined4 *)((long)plVar6 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_a8 + (long)local_b0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
  error_handler::on_error((error_handler *)(this + 0x18),&local_70);
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, int id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("Argument index \"" + std::to_string(id) + "\" out of range");
  return arg;
}